

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ralocal.cpp
# Opt level: O1

Error __thiscall
asmjit::RALocalAllocator::spillAfterAllocation(RALocalAllocator *this,InstNode *node)

{
  uint32_t **ppuVar1;
  uint32_t **ppuVar2;
  byte bVar3;
  BaseNode *node_00;
  WorkToPhysMap *pWVar4;
  BaseCompiler *pBVar5;
  PhysToWorkMap *pPVar6;
  PhysToWorkMap *pPVar7;
  uint32_t *puVar8;
  uint32_t *puVar9;
  Error EVar10;
  uint uVar11;
  uint32_t *puVar12;
  Operand_ *pOVar13;
  long lVar14;
  RABlock *block;
  RALocalAllocator *pRVar15;
  InstNode *node_01;
  RALocalAllocator *this_00;
  ulong unaff_R12;
  BaseNode *unaff_R13;
  uint uVar16;
  ulong unaff_R15;
  bool bVar17;
  uint32_t uStack_b0;
  uint32_t uStack_ac;
  uint32_t uStack_a8;
  uint32_t uStack_a4;
  undefined8 uStack_a0;
  undefined8 uStack_98;
  RALocalAllocator *pRStack_88;
  ulong uStack_80;
  BaseNode *pBStack_78;
  RALocalAllocator *pRStack_70;
  ulong uStack_68;
  uint32_t *puStack_60;
  Error local_54;
  RAAssignment *local_50;
  RALocalAllocator *local_48;
  InstNode *local_40;
  InstNode *local_38;
  
  node_01 = (InstNode *)(node->super_BaseNode)._passData;
  this_00 = (RALocalAllocator *)(ulong)*(uint *)((long)&(node_01->super_BaseNode).field_0 + 0xc);
  if (this_00 != (RALocalAllocator *)0x0) {
    local_50 = &this->_curAssignment;
    puVar12 = node_01->_opArray[0]._data + 1;
    pRVar15 = (RALocalAllocator *)0x0;
    local_48 = this_00;
    local_40 = node_01;
    local_38 = node;
    do {
      if ((RALocalAllocator *)(ulong)*(uint *)((long)&(node_01->super_BaseNode).field_0 + 0xc) <=
          pRVar15) {
        puStack_60 = (uint32_t *)0x11e495;
        spillAfterAllocation();
LAB_0011e495:
        puStack_60 = (uint32_t *)0x11e49a;
        spillAfterAllocation();
LAB_0011e49a:
        puStack_60 = (uint32_t *)0x11e49f;
        spillAfterAllocation();
LAB_0011e49f:
        puStack_60 = (uint32_t *)0x11e4a4;
        spillAfterAllocation();
LAB_0011e4a4:
        puStack_60 = (uint32_t *)0x11e4a9;
        spillAfterAllocation();
LAB_0011e4a9:
        puStack_60 = (uint32_t *)allocBranch;
        spillAfterAllocation();
        (this_00->_cc->super_BaseBuilder)._cursor = (node_01->super_BaseNode).field_0.field_0._prev;
        pRStack_88 = pRVar15;
        uStack_80 = unaff_R12;
        pBStack_78 = unaff_R13;
        pRStack_70 = this;
        uStack_68 = unaff_R15;
        puStack_60 = puVar12;
        if (block->_entryPhysToWorkMap != (PhysToWorkMap *)0x0) {
          EVar10 = switchToAssignment(this_00,block->_entryPhysToWorkMap,block->_entryWorkToPhysMap,
                                      block->_liveBits,SUB41((block->_flags & 8) >> 3,0),true);
          pRVar15 = (RALocalAllocator *)(ulong)EVar10;
          if (EVar10 != 0) {
            return EVar10;
          }
        }
        EVar10 = allocInst(this_00,node_01);
        if (EVar10 != 0) {
          return EVar10;
        }
        uVar11 = block->_sharedAssignmentId;
        if ((ulong)uVar11 == 0xffffffff) {
          puVar12 = &block->_entryScratchGpRegs;
LAB_0011e564:
          EVar10 = spillScratchGpRegsBeforeEntry(this_00,*puVar12);
          if (EVar10 != 0) {
            return EVar10;
          }
          if (block->_entryPhysToWorkMap == (PhysToWorkMap *)0x0) {
            EVar10 = BaseRAPass::setBlockEntryAssignment
                               (this_00->_pass,block,this_00->_block,&this_00->_curAssignment);
            if (EVar10 != 0) {
              return EVar10;
            }
            goto LAB_0011e733;
          }
          node_00 = (this_00->_pass->_extraBlock->field_0).field_0._prev;
          unaff_R13 = BaseBuilder::setCursor(&this_00->_cc->super_BaseBuilder,node_00);
          pWVar4 = (this_00->_curAssignment)._workToPhysMap;
          memcpy((this_00->_tmpAssignment)._physToWorkMap,(this_00->_curAssignment)._physToWorkMap,
                 (ulong)(this_00->_tmpAssignment)._layout.physTotal * 4 + 0x20);
          memcpy((this_00->_tmpAssignment)._workToPhysMap,pWVar4,
                 (ulong)(this_00->_tmpAssignment)._layout.workCount);
          bVar17 = false;
          EVar10 = switchToAssignment(this_00,block->_entryPhysToWorkMap,block->_entryWorkToPhysMap,
                                      block->_liveBits,SUB41((block->_flags & 8) >> 3,0),false);
          if (EVar10 != 0) goto LAB_0011e72e;
          EVar10 = (Error)pRVar15;
          if ((this_00->_cc->super_BaseBuilder)._cursor != node_00) {
            uVar11 = (node_01->super_BaseNode).field_1._any._reserved0 - 1;
            if ((node_01->super_BaseNode).field_1._any._reserved1 <= uVar11) goto LAB_0011e74b;
            if ((node_01->_opArray[uVar11]._signature & 7) != 4) goto LAB_0011e750;
            (*(this_00->_cc->super_BaseBuilder).super_BaseEmitter._vptr_BaseEmitter[4])(&uStack_b0);
            pOVar13 = node_01->_opArray + uVar11;
            uStack_a0._0_4_ = pOVar13->_signature;
            uStack_a0._4_4_ = pOVar13->_baseId;
            uStack_98 = *(undefined8 *)node_01->_opArray[uVar11]._data;
            pOVar13->_signature = uStack_b0;
            node_01->_opArray[uVar11]._baseId = uStack_ac;
            node_01->_opArray[uVar11]._data[0] = uStack_a8;
            node_01->_opArray[uVar11]._data[1] = uStack_a4;
            puVar12 = &(node_01->_baseInst)._options;
            *(byte *)puVar12 = (byte)*puVar12 & 0xef;
            EVar10 = (*(this_00->_pass->super_FuncPass).super_Pass._vptr_Pass[0xd])();
            bVar17 = EVar10 == 0;
            if (bVar17) {
              pBVar5 = this_00->_cc;
              (pBVar5->super_BaseBuilder)._cursor = node_00;
              (*(pBVar5->super_BaseBuilder).super_BaseEmitter._vptr_BaseEmitter[6])
                        (pBVar5,&uStack_b0);
              EVar10 = (Error)pRVar15;
            }
            goto LAB_0011e6b3;
          }
        }
        else {
          if (uVar11 < (block->_ra->_sharedAssignments).super_ZoneVectorBase._size) {
            puVar12 = (uint32_t *)
                      ((ulong)uVar11 * 0x28 +
                      (long)(block->_ra->_sharedAssignments).super_ZoneVectorBase._data);
            goto LAB_0011e564;
          }
          allocBranch();
LAB_0011e74b:
          allocBranch();
LAB_0011e750:
          EVar10 = 3;
          bVar17 = false;
LAB_0011e6b3:
          if (!bVar17) {
            bVar17 = false;
            goto LAB_0011e72e;
          }
        }
        (this_00->_cc->super_BaseBuilder)._cursor = unaff_R13;
        pWVar4 = (this_00->_curAssignment)._workToPhysMap;
        pPVar6 = (this_00->_curAssignment)._physToWorkMap;
        pPVar7 = (this_00->_tmpAssignment)._physToWorkMap;
        (this_00->_curAssignment)._workToPhysMap = (this_00->_tmpAssignment)._workToPhysMap;
        (this_00->_curAssignment)._physToWorkMap = pPVar7;
        (this_00->_tmpAssignment)._workToPhysMap = pWVar4;
        (this_00->_tmpAssignment)._physToWorkMap = pPVar6;
        lVar14 = 0;
        do {
          ppuVar1 = (this_00->_curAssignment)._physToWorkIds + lVar14;
          puVar12 = *ppuVar1;
          puVar8 = ppuVar1[1];
          ppuVar2 = (this_00->_tmpAssignment)._physToWorkIds + lVar14;
          puVar9 = ppuVar2[1];
          ppuVar1 = (this_00->_curAssignment)._physToWorkIds + lVar14;
          *ppuVar1 = *ppuVar2;
          ppuVar1[1] = puVar9;
          ppuVar1 = (this_00->_tmpAssignment)._physToWorkIds + lVar14;
          *ppuVar1 = puVar12;
          ppuVar1[1] = puVar8;
          lVar14 = lVar14 + 2;
        } while (lVar14 != 4);
        bVar17 = true;
LAB_0011e72e:
        if (bVar17) {
LAB_0011e733:
          EVar10 = 0;
        }
        return EVar10;
      }
      bVar17 = true;
      if ((*puVar12 & 0x20000) != 0) {
        uVar11 = puVar12[-1];
        unaff_R12 = (ulong)uVar11;
        if ((this->_pass->_workRegs).super_ZoneVectorBase._size <= uVar11) goto LAB_0011e495;
        lVar14 = *(long *)((long)(this->_pass->_workRegs).super_ZoneVectorBase._data + unaff_R12 * 8
                          );
        if (*(char *)(lVar14 + 0x3a) != -1) goto LAB_0011e465;
        if (uVar11 == 0xffffffff) goto LAB_0011e49a;
        if ((this->_curAssignment)._layout.workCount <= uVar11) goto LAB_0011e49f;
        bVar3 = (this->_curAssignment)._workToPhysMap[unaff_R12].physIds[0];
        unaff_R13 = (BaseNode *)(ulong)bVar3;
        if (bVar3 == 0xff) goto LAB_0011e465;
        uVar16 = *(uint *)(lVar14 + 0x20);
        unaff_R15 = (ulong)uVar16;
        (this->_cc->super_BaseBuilder)._cursor = &local_38->super_BaseNode;
        if (0x1f < bVar3) goto LAB_0011e4a4;
        uVar16 = uVar16 >> 8 & 0xf;
        unaff_R15 = (ulong)uVar16;
        if (3 < uVar16) goto LAB_0011e4a9;
        if (((((this->_curAssignment)._physToWorkMap)->dirty)._masks[unaff_R15] >> (bVar3 & 0x1f) &
            1) == 0) {
LAB_0011e436:
          puStack_60 = (uint32_t *)0x11e449;
          RAAssignment::unassign(local_50,uVar16,uVar11,(uint)bVar3);
          EVar10 = 0;
        }
        else {
          puStack_60 = (uint32_t *)0x11e432;
          EVar10 = onSaveReg(this,uVar16,uVar11,(uint)bVar3);
          if (EVar10 == 0) goto LAB_0011e436;
        }
        bVar17 = EVar10 == 0;
        node_01 = local_40;
        this_00 = local_48;
        if (!bVar17) {
          local_54 = EVar10;
        }
      }
LAB_0011e465:
      if (!bVar17) {
        return local_54;
      }
      pRVar15 = (RALocalAllocator *)((long)&pRVar15->_pass + 1);
      puVar12 = puVar12 + 6;
    } while (this_00 != pRVar15);
  }
  return 0;
}

Assistant:

Error RALocalAllocator::spillAfterAllocation(InstNode* node) noexcept {
  // This is experimental feature that would spill registers that don't have
  // home-id and are last in this basic block. This prevents saving these regs
  // in other basic blocks and then restoring them (mostly relevant for loops).
  RAInst* raInst = node->passData<RAInst>();
  uint32_t count = raInst->tiedCount();

  for (uint32_t i = 0; i < count; i++) {
    RATiedReg* tiedReg = raInst->tiedAt(i);
    if (tiedReg->isLast()) {
      uint32_t workId = tiedReg->workId();
      RAWorkReg* workReg = workRegById(workId);
      if (!workReg->hasHomeRegId()) {
        uint32_t group = workReg->group();
        uint32_t assignedId = _curAssignment.workToPhysId(group, workId);
        if (assignedId != RAAssignment::kPhysNone) {
          _cc->_setCursor(node);
          ASMJIT_PROPAGATE(onSpillReg(group, workId, assignedId));
        }
      }
    }
  }

  return kErrorOk;
}